

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,ScopedMessage *old)

{
  pointer pcVar1;
  size_t sVar2;
  uint uVar3;
  
  (this->m_info).macroName.m_start = (old->m_info).macroName.m_start;
  (this->m_info).macroName.m_size = (old->m_info).macroName.m_size;
  (this->m_info).macroName.m_data = (char *)0x0;
  (this->m_info).message._M_dataplus._M_p = (pointer)&(this->m_info).message.field_2;
  pcVar1 = (old->m_info).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).message,pcVar1,
             pcVar1 + (old->m_info).message._M_string_length);
  uVar3 = (old->m_info).sequence;
  (this->m_info).type = (old->m_info).type;
  (this->m_info).sequence = uVar3;
  sVar2 = (old->m_info).lineInfo.line;
  (this->m_info).lineInfo.file = (old->m_info).lineInfo.file;
  (this->m_info).lineInfo.line = sVar2;
  this->m_moved = false;
  old->m_moved = true;
  return;
}

Assistant:

ScopedMessage::ScopedMessage( ScopedMessage&& old )
    : m_info( old.m_info ), m_moved()
    {
        old.m_moved = true;
    }